

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLast
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  
  iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
  if (0 < iVar1) {
    uVar4 = iVar1 - 1;
    pNVar2 = this->head_;
    do {
      pNVar3 = pNVar2->next_[uVar4]._M_b._M_p;
      if (pNVar3 == (Node *)0x0) {
        if (uVar4 == 0) {
          return pNVar2;
        }
        uVar4 = uVar4 - 1;
        pNVar3 = pNVar2;
      }
      pNVar2 = pNVar3;
    } while (-1 < (int)uVar4);
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                ,0x9a,
                "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}